

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O2

InplaceStr GetFunctionVariableUpvalueName(ExpressionContext *ctx,VariableData *variable)

{
  byte bVar1;
  InplaceStr name;
  InplaceStr IVar2;
  InplaceStr IVar3;
  long lVar4;
  int iVar5;
  FunctionData *pFVar6;
  undefined4 extraout_var;
  char *pcVar7;
  size_t sVar8;
  char *unaff_R12;
  char *pcVar9;
  ulong uVar10;
  char *unaff_R13;
  ulong uVar11;
  InplaceStr IVar12;
  InplaceStr IVar13;
  
  pFVar6 = ExpressionContext::GetFunctionOwner(ctx,variable->scope);
  if (pFVar6 == (FunctionData *)0x0) {
    pcVar9 = "";
    pcVar7 = "global";
  }
  else {
    pcVar7 = (pFVar6->name->name).begin;
    pcVar9 = (pFVar6->name->name).end;
  }
  IVar3.end = pcVar9;
  IVar3.begin = pcVar7;
  IVar12.end = pcVar9;
  IVar12.begin = pcVar7;
  IVar2.end = pcVar9;
  IVar2.begin = pcVar7;
  bVar1 = *pcVar7;
  if ((((char)bVar1 < 'A' && bVar1 != 0x24) ||
      ((bVar1 - 0x5e < 0x21 &&
       (IVar2 = IVar12, (0x140000001U >> ((ulong)(bVar1 - 0x5e) & 0x3f) & 1) != 0)))) &&
     (name.end = unaff_R13, name.begin = unaff_R12, IVar12 = GetOperatorName(name), IVar2 = IVar3,
     IVar12.begin != IVar12.end)) {
    IVar2 = IVar12;
  }
  uVar10 = (long)IVar2.end - (long)IVar2.begin;
  uVar11 = (ulong)((int)uVar10 +
                   (*(int *)&(variable->name->name).end - *(int *)&(variable->name->name).begin) +
                  0x19);
  iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,uVar11);
  IVar13.begin = (char *)CONCAT44(extraout_var,iVar5);
  builtin_strncpy(IVar13.begin,"$upvalue_",10);
  uVar10 = uVar10 & 0xffffffff;
  memcpy(IVar13.begin + 9,IVar2.begin,uVar10);
  (IVar13.begin + uVar10 + 10)[-1] = '_';
  pcVar7 = (variable->name->name).begin;
  memcpy(IVar13.begin + uVar10 + 10,pcVar7,
         (ulong)(uint)(*(int *)&(variable->name->name).end - (int)pcVar7));
  lVar4 = (ulong)(uint)(*(int *)&(variable->name->name).end - *(int *)&(variable->name->name).begin)
          + uVar10 + 9;
  IVar13.begin[lVar4 + 1] = '_';
  pcVar7 = NameWriteUnsigned(IVar13.begin + lVar4 + 2,variable->uniqueId);
  *pcVar7 = '\0';
  sVar8 = strlen(IVar13.begin);
  if (uVar11 <= sVar8) {
    __assert_fail("strlen(name) < nameLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                  ,0x204,
                  "InplaceStr GetFunctionVariableUpvalueName(ExpressionContext &, VariableData *)");
  }
  IVar13.end = IVar13.begin + sVar8;
  return IVar13;
}

Assistant:

InplaceStr GetFunctionVariableUpvalueName(ExpressionContext &ctx, VariableData *variable)
{
	FunctionData *function = ctx.GetFunctionOwner(variable->scope);

	InplaceStr functionName = function ? function->name->name : InplaceStr("global");

	if((*functionName.begin <= '@' && *functionName.begin != '$') || *functionName.begin == '|' || *functionName.begin == '^' || *functionName.begin == '~')
	{
		InplaceStr operatorName = GetOperatorName(functionName);

		if(!operatorName.empty())
			functionName = operatorName;
	}

	unsigned nameLength = functionName.length() + variable->name->name.length() + 24 + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	strcpy(pos, "$upvalue_");
	pos += strlen("$upvalue_");

	memcpy(pos, functionName.begin, functionName.length());
	pos += functionName.length();

	*pos++ = '_';

	memcpy(pos, variable->name->name.begin, variable->name->name.length());
	pos += variable->name->name.length();

	*pos++ = '_';
	pos = NameWriteUnsigned(pos, variable->uniqueId);

	*pos++ = 0;

	assert(strlen(name) < nameLength);
	return InplaceStr(name);
}